

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtendedKalmanFilter.cpp
# Opt level: O0

void __thiscall ExtendedKalmanFilter_init_Test::TestBody(ExtendedKalmanFilter_init_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_118;
  AssertHelper local_f8;
  Message local_f0;
  float local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar__1;
  ExtendedKalmanFilter<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> ekfMatrix;
  AssertHelper local_78;
  Message local_70 [3];
  float local_54;
  undefined1 local_50 [8];
  AssertionResult gtest_ar_;
  ExtendedKalmanFilter<Kalman::Vector<float,_3>_> ekf;
  ExtendedKalmanFilter_init_Test *this_local;
  
  ekf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._28_8_ = this;
  Kalman::ExtendedKalmanFilter<Kalman::Vector<float,_3>_>::ExtendedKalmanFilter
            ((ExtendedKalmanFilter<Kalman::Vector<float,_3>_> *)&gtest_ar_.message_);
  local_54 = Eigen::NumTraits<float>::dummy_precision();
  bVar1 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::isIdentity
                    ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                     ((long)&ekf.super_KalmanFilterBase<Kalman::Vector<float,_3>_>.x.
                             super_Matrix<float,_3,_1>.
                             super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data + 4),&local_54);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_50,bVar1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               ((long)&ekfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                       super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                       super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
               + 0x20),(internal *)local_50,(AssertionResult *)"ekf.P.isIdentity()","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/ExtendedKalmanFilter.cpp"
               ,0xe,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string
              ((string *)
               ((long)&ekfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                       super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                       super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
               + 0x20));
    testing::Message::~Message(local_70);
  }
  ekfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
  super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       (float)(uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  if (ekfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
      super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] == 0.0)
  {
    Kalman::ExtendedKalmanFilter<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::ExtendedKalmanFilter
              ((ExtendedKalmanFilter<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
               ((long)&gtest_ar__1.message_.ptr_ + 4));
    local_e4 = Eigen::NumTraits<float>::dummy_precision();
    bVar1 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::isIdentity
                      ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                       ((long)ekfMatrix.super_KalmanFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                              .x.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                              m_storage.m_data.array + 4),&local_e4);
    testing::AssertionResult::AssertionResult((AssertionResult *)local_e0,bVar1);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
    if (!bVar1) {
      testing::Message::Message(&local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_118,(internal *)local_e0,(AssertionResult *)"ekfMatrix.P.isIdentity()",
                 "false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/ExtendedKalmanFilter.cpp"
                 ,0x12,pcVar2);
      testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      testing::Message::~Message(&local_f0);
    }
    ekfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
    super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
         (float)(uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  }
  return;
}

Assistant:

TEST(ExtendedKalmanFilter, init) {
    ExtendedKalmanFilter<Vector<T, 3>> ekf;
    ASSERT_TRUE(ekf.P.isIdentity()); // P should be identity

    // Same as above, but with general matrix type instead of vector
    ExtendedKalmanFilter<Matrix<T, 3, 1>> ekfMatrix;
    ASSERT_TRUE(ekfMatrix.P.isIdentity()); // P should be identity
}